

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O2

void olsrv2_routing_trigger_update(void)

{
  _trigger_dijkstra = 1;
  if (_rate_limit_timer._clock == 0) {
    oonf_timer_set_ext(&_rate_limit_timer,1,1);
  }
  if (((&log_global_mask)[LOG_OLSRV2_ROUTING] & 1) != 0) {
    oonf_log(1,(ulong)LOG_OLSRV2_ROUTING,"src/olsrv2/olsrv2/olsrv2_routing.c",0xf8,0,0,
             "Trigger routing update");
  }
  return;
}

Assistant:

void
olsrv2_routing_trigger_update(void) {
  _trigger_dijkstra = true;
  if (!oonf_timer_is_active(&_rate_limit_timer)) {
    /* trigger as soon as we hit the next time slice */
    oonf_timer_set(&_rate_limit_timer, 1);
  }

  OONF_DEBUG(LOG_OLSRV2_ROUTING, "Trigger routing update");
}